

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O1

void vk::BinaryRegistryDetail::anon_unknown_8::addToSparseIndex
               (SparseIndexNode *group,deUint32 *words,size_t numWords,deUint32 index)

{
  deUint32 dVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  value_type in_RAX;
  deUint32 dVar4;
  SparseIndexNode *pSVar5;
  long lVar6;
  long lVar7;
  value_type local_38;
  
  local_38 = in_RAX;
  do {
    ppSVar2 = (group->children).
              super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppSVar3 = (group->children).
              super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)ppSVar3 - (long)ppSVar2 >> 3;
    dVar1 = *words;
    if (ppSVar3 != ppSVar2) {
      lVar7 = 0;
      do {
        pSVar5 = ppSVar2[lVar7];
        if (pSVar5->word == dVar1) goto LAB_00a0a776;
        lVar7 = lVar7 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
    }
    pSVar5 = (SparseIndexNode *)0x0;
LAB_00a0a776:
    if (pSVar5 == (SparseIndexNode *)0x0) {
      std::
      vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ::reserve(&group->children,lVar6 + 1);
      local_38 = (value_type)operator_new(0x20);
      dVar4 = 0;
      if (numWords == 1) {
        dVar4 = index;
      }
      local_38->word = dVar1;
      local_38->index = dVar4;
      (local_38->children).
      super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_38->children).
      super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_38->children).
      super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ::push_back(&group->children,&local_38);
      pSVar5 = (group->children).
               super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1];
    }
    if (numWords < 2) {
      return;
    }
    words = words + 1;
    numWords = numWords - 1;
    group = pSVar5;
  } while( true );
}

Assistant:

void addToSparseIndex (SparseIndexNode* group, const deUint32* words, size_t numWords, deUint32 index)
{
	const deUint32		curWord	= words[0];
	SparseIndexNode*	child	= DE_NULL;

	for (size_t childNdx = 0; childNdx < group->children.size(); childNdx++)
	{
		if (group->children[childNdx]->word == curWord)
		{
			child = group->children[childNdx];
			break;
		}
	}

	DE_ASSERT(numWords > 1 || !child);

	if (!child)
	{
		group->children.reserve(group->children.size()+1);
		group->children.push_back(new SparseIndexNode(curWord, numWords == 1 ? index : 0));

		child = group->children.back();
	}

	if (numWords > 1)
		addToSparseIndex(child, words+1, numWords-1, index);
	else
		DE_ASSERT(isNullByteTerminated(curWord));
}